

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O2

void genrandomnumbers(bool skipheader,int total,int seed)

{
  result_type_conflict1 rVar1;
  int iVar2;
  bool bVar3;
  random_device rd;
  mt19937 mt;
  uniform_real_distribution<double> local_2748;
  random_device local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  
  std::random_device::random_device(&local_2730);
  local_2748._M_param._M_a._0_4_ = 0;
  local_2748._M_param._M_a._4_4_ = 0;
  local_2748._M_param._M_b._0_4_ = 0;
  local_2748._M_param._M_b._4_4_ = 0x3ff00000;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13a8);
  if (seed < 1) {
    seed = std::random_device::_M_getval();
  }
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a8,(ulong)(uint)seed);
  if (!skipheader) {
    puts("\"random_no\"");
  }
  iVar2 = 0;
  if (0 < total) {
    iVar2 = total;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_2748,&local_13a8);
    printf("%f\n",SUB84((double)(float)rVar1,0));
  }
  std::random_device::~random_device(&local_2730);
  return;
}

Assistant:

void genrandomnumbers(bool skipheader, int total, int seed)
{
	std::random_device rd;
	std::uniform_real_distribution<> dis(0, 1);
	std::mt19937 mt;
	if (seed > 0) mt.seed(seed);
	else mt.seed(rd());
	if (skipheader == false) printf("\"random_no\"\n");
	for (int i = 0; i < total; i++) {
		OASIS_FLOAT f = (OASIS_FLOAT)dis(mt);
		printf("%f\n", f);
	}
}